

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonparser.cpp
# Opt level: O0

bool __thiscall QJsonPrivate::Parser::parseString(Parser *this)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  QCborContainerPrivate *pQVar5;
  qsizetype qVar6;
  Type type;
  QString *in_RDI;
  long in_FS_OFFSET;
  bool isAscii;
  bool isUtf8;
  char *start;
  char32_t ch_1;
  QString ucs4;
  char32_t ch;
  char32_t in_stack_ffffffffffffff78;
  ValueFlag in_stack_ffffffffffffff7c;
  char32_t *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  QStringView in_stack_ffffffffffffffa0;
  char32_t *result;
  QFlagsStorage<QtCbor::Element::ValueFlag> in_stack_ffffffffffffffcc;
  byte bVar7;
  QString local_28;
  uint local_10;
  char16_t local_c [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  result = (char32_t *)(in_RDI->d).ptr;
  bVar4 = true;
  bVar2 = true;
  while( true ) {
    pQVar5 = (QCborContainerPrivate *)in_stack_ffffffffffffffa0.m_data;
    if (((char16_t *)(in_RDI->d).size <= (in_RDI->d).ptr) ||
       (local_10 = 0, (char)*(in_RDI->d).ptr == '\"')) goto LAB_00137b7a;
    if ((char)*(in_RDI->d).ptr == '\\') break;
    bVar3 = scanUtf8Char((char **)pQVar5,(char *)in_RDI,result);
    if (!bVar3) {
      pcVar1 = (char *)((long)&in_RDI[1].d.d + 4);
      pcVar1[0] = '\t';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      bVar7 = 0;
      goto LAB_00137e09;
    }
    if (0x7f < local_10) {
      bVar2 = false;
    }
  }
  bVar2 = false;
  bVar4 = false;
LAB_00137b7a:
  (in_RDI->d).ptr = (char16_t *)((long)(in_RDI->d).ptr + 1);
  if ((char16_t *)(in_RDI->d).size < (in_RDI->d).ptr) {
    pcVar1 = (char *)((long)&in_RDI[1].d.d + 4);
    pcVar1[0] = '\n';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    bVar7 = 0;
  }
  else if (bVar4) {
    if (bVar2) {
      QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
                ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x137bc7);
      QCborContainerPrivate::appendAsciiString
                (pQVar5,(char *)in_RDI,(qsizetype)in_stack_ffffffffffffff90);
    }
    else {
      QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
                ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x137bf9);
      QCborContainerPrivate::appendUtf8String
                (pQVar5,(char *)in_RDI,(qsizetype)in_stack_ffffffffffffff90);
    }
    bVar7 = 1;
  }
  else {
    (in_RDI->d).ptr = (char16_t *)result;
    local_28.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_28.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_28.d.size = -0x5555555555555556;
    QString::QString((QString *)0x137c61);
    while (((in_RDI->d).ptr < (char16_t *)(in_RDI->d).size && ((char)*(in_RDI->d).ptr != '\"'))) {
      if ((char)*(in_RDI->d).ptr == '\\') {
        bVar4 = scanEscapeSequence((char **)in_RDI,in_stack_ffffffffffffff90,
                                   in_stack_ffffffffffffff88);
        if (!bVar4) {
          *(undefined4 *)((long)&in_RDI[1].d.d + 4) = 8;
          bVar7 = 0;
          goto LAB_00137dff;
        }
      }
      else {
        bVar4 = scanUtf8Char((char **)in_stack_ffffffffffffffa0.m_data,(char *)in_RDI,result);
        if (!bVar4) {
          *(undefined4 *)((long)&in_RDI[1].d.d + 4) = 9;
          bVar7 = 0;
          goto LAB_00137dff;
        }
      }
      local_c = (char16_t  [2])QChar::fromUcs4(in_stack_ffffffffffffff78);
      in_stack_ffffffffffffffa0 =
           QChar::fromUcs4(char32_t)::R::operator_cast_to_QStringView((R_conflict *)in_RDI);
      QString::append(in_RDI,in_stack_ffffffffffffffa0);
    }
    (in_RDI->d).ptr = (char16_t *)((long)(in_RDI->d).ptr + 1);
    if ((char16_t *)(in_RDI->d).size < (in_RDI->d).ptr) {
      *(undefined4 *)((long)&in_RDI[1].d.d + 4) = 10;
      bVar7 = 0;
    }
    else {
      pQVar5 = QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
                         ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x137d9f);
      QString::constData((QString *)0x137dae);
      qVar6 = QString::size(&local_28);
      type = (Type)((ulong)(qVar6 << 1) >> 0x20);
      QFlags<QtCbor::Element::ValueFlag>::QFlags
                ((QFlags<QtCbor::Element::ValueFlag> *)pQVar5,in_stack_ffffffffffffff7c);
      QCborContainerPrivate::appendByteData
                ((QCborContainerPrivate *)in_stack_ffffffffffffffa0.m_size,
                 (char *)in_stack_ffffffffffffffa0.m_data,(qsizetype)in_RDI,type,
                 (ValueFlags)in_stack_ffffffffffffffcc.i);
      bVar7 = 1;
    }
LAB_00137dff:
    QString::~QString((QString *)0x137e09);
  }
LAB_00137e09:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(bVar7 & 1);
}

Assistant:

bool Parser::parseString()
{
    const char *start = json;

    // try to parse a utf-8 string without escape sequences, and note whether it's 7bit ASCII.

    bool isUtf8 = true;
    bool isAscii = true;
    while (json < end) {
        char32_t ch = 0;
        if (*json == '"')
            break;
        if (*json == '\\') {
            isAscii = false;
            // If we find escape sequences, we store UTF-16 as there are some
            // escape sequences which are hard to represent in UTF-8.
            // (plain "\\ud800" for example)
            isUtf8 = false;
            break;
        }
        if (!scanUtf8Char(json, end, &ch)) {
            lastError = QJsonParseError::IllegalUTF8String;
            return false;
        }
        if (ch > 0x7f)
            isAscii = false;
    }
    ++json;
    if (json > end) {
        lastError = QJsonParseError::UnterminatedString;
        return false;
    }

    // no escape sequences, we are done
    if (isUtf8) {
        if (isAscii)
            container->appendAsciiString(start, json - start - 1);
        else
            container->appendUtf8String(start, json - start - 1);
        return true;
    }

    json = start;

    QString ucs4;
    while (json < end) {
        char32_t ch = 0;
        if (*json == '"')
            break;
        else if (*json == '\\') {
            if (!scanEscapeSequence(json, end, &ch)) {
                lastError = QJsonParseError::IllegalEscapeSequence;
                return false;
            }
        } else {
            if (!scanUtf8Char(json, end, &ch)) {
                lastError = QJsonParseError::IllegalUTF8String;
                return false;
            }
        }
        ucs4.append(QChar::fromUcs4(ch));
    }
    ++json;

    if (json > end) {
        lastError = QJsonParseError::UnterminatedString;
        return false;
    }

    container->appendByteData(reinterpret_cast<const char *>(ucs4.constData()), ucs4.size() * 2,
                              QCborValue::String, QtCbor::Element::StringIsUtf16);
    return true;
}